

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

int luaO_int2fb(uint x)

{
  uint uVar1;
  
  uVar1 = 8;
  for (; 0xf < x; x = x + 1 >> 1) {
    uVar1 = uVar1 + 8;
  }
  uVar1 = uVar1 | x - 8;
  if (x < 8) {
    uVar1 = x;
  }
  return uVar1;
}

Assistant:

int luaO_int2fb (unsigned int x) {
  int e = 0;  /* expoent */
  while (x >= 16) {
    x = (x+1) >> 1;
    e++;
  }
  if (x < 8) return x;
  else return ((e+1) << 3) | (cast_int(x) - 8);
}